

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall cfd::core::BlindFactor::BlindFactor(BlindFactor *this,string *hex_string)

{
  long lVar1;
  CfdException *this_00;
  ByteData256 local_d8;
  allocator<unsigned_char> local_b9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0 [8];
  undefined1 local_a8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  string local_68;
  unsigned_long local_38;
  CfdSourceLocation local_30;
  string *local_18;
  string *hex_string_local;
  BlindFactor *this_local;
  
  this->_vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_003ebf68;
  local_18 = hex_string;
  hex_string_local = (string *)this;
  ByteData256::ByteData256(&this->data_);
  lVar1 = ::std::__cxx11::string::size();
  if (lVar1 != 0x40) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x2a7;
    local_30.funcname = "BlindFactor";
    local_38 = ::std::__cxx11::string::size();
    logger::warn<unsigned_long>(&local_30,"Value hex-string-length Invalid. length={}.",&local_38);
    data._6_1_ = 1;
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_68,"Value hex string length Invalid.",(allocator *)((long)&data + 7)
              );
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_68);
    data._6_1_ = 0;
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_18);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crbegin(local_b0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crend(local_b8);
  ::std::allocator<unsigned_char>::allocator(&local_b9);
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_a8,
             (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_b0,
             (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_b8,&local_b9);
  ::std::allocator<unsigned_char>::~allocator(&local_b9);
  ByteData256::ByteData256
            (&local_d8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  ByteData256::operator=(&this->data_,&local_d8);
  ByteData256::~ByteData256(&local_d8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BlindFactor::BlindFactor(const std::string &hex_string) : data_() {
  if (hex_string.size() != (kByteData256Length * 2)) {
    warn(
        CFD_LOG_SOURCE, "Value hex-string-length Invalid. length={}.",
        hex_string.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Value hex string length Invalid.");
  }
  const std::vector<uint8_t> &data = StringUtil::StringToByte(hex_string);
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  data_ = ByteData256(reverse_buffer);
}